

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

TProb<double> * __thiscall libDAI::TProb<double>::divide(TProb<double> *this,TProb<double> *q)

{
  size_t sVar1;
  reference pvVar2;
  TProb<double> *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffc8;
  TProb<double> *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = size((TProb<double> *)0xb1d5d5);
    if (sVar1 <= local_18) break;
    in_stack_ffffffffffffffd0 =
         (TProb<double> *)operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->_p,local_18);
    *pvVar2 = *pvVar2 / (double)in_stack_ffffffffffffffd0;
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

TProb<T>& divide (const TProb<T> & q) {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                for( size_t i = 0; i < size(); i++ )
                    _p[i] /= q[i];
                return *this;
            }